

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

double units::detail::convertCountingUnits<units::unit,units::unit>
                 (double val,unit *start,unit *result)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  int muxIndex_1;
  int muxIndex;
  int mol_result;
  int mol_start;
  int count_result;
  int count_start;
  int rad_result;
  int rad_start;
  unit_data base_result;
  unit_data base_start;
  unit *result_local;
  unit *start_local;
  double val_local;
  
  _base_result = result;
  rad_start = (int)unit::base_units(start);
  rad_result = (int)unit::base_units(_base_result);
  iVar1 = unit_data::radian((unit_data *)&rad_start);
  iVar2 = unit_data::radian((unit_data *)&rad_result);
  iVar3 = unit_data::count((unit_data *)&rad_start);
  iVar4 = unit_data::count((unit_data *)&rad_result);
  iVar5 = unit_data::mole((unit_data *)&rad_start);
  iVar6 = unit_data::mole((unit_data *)&rad_result);
  if (((iVar5 == iVar6) && (iVar1 == iVar2)) && ((iVar3 == 0 || (iVar4 == 0)))) {
    dVar9 = unit::multiplier(start);
    dVar10 = unit::multiplier(_base_result);
    val_local = (val * dVar9) / dVar10;
  }
  else if ((iVar5 == iVar6) &&
          (((iVar1 == 0 && ((iVar3 == iVar2 || (iVar3 == 0)))) ||
           ((iVar2 == 0 && ((iVar4 == iVar1 || (iVar4 == 0)))))))) {
    iVar1 = (iVar2 - iVar1) + 2;
    if ((iVar1 < 0) || (4 < iVar1)) {
      val_local = NAN;
    }
    else {
      pvVar7 = std::array<double,_5UL>::operator[]
                         (&convertCountingUnits<units::unit,_units::unit>::muxrad,(long)iVar1);
      dVar9 = *pvVar7;
      dVar10 = unit::multiplier(start);
      dVar11 = unit::multiplier(_base_result);
      val_local = (dVar9 * val * dVar10) / dVar11;
    }
  }
  else if ((iVar1 == iVar2) &&
          (((iVar5 == 0 && ((iVar3 == iVar6 || (iVar3 == 0)))) ||
           ((iVar6 == 0 && ((iVar4 == iVar5 || (iVar4 == 0)))))))) {
    iVar1 = (iVar6 - iVar5) + 1;
    if ((iVar1 < 0) || (2 < iVar1)) {
      val_local = NAN;
    }
    else {
      pvVar8 = std::array<double,_3UL>::operator[]
                         (&convertCountingUnits<units::unit,_units::unit>::muxmol,(long)iVar1);
      dVar9 = *pvVar8;
      dVar10 = unit::multiplier(start);
      dVar11 = unit::multiplier(_base_result);
      val_local = (dVar9 * val * dVar10) / dVar11;
    }
  }
  else {
    val_local = NAN;
  }
  return val_local;
}

Assistant:

inline double
        convertCountingUnits(double val, const UX& start, const UX2& result)
    {
        auto base_start = start.base_units();
        auto base_result = result.base_units();

        auto rad_start = base_start.radian();
        auto rad_result = base_result.radian();
        auto count_start = base_start.count();
        auto count_result = base_result.count();
        auto mol_start = base_start.mole();
        auto mol_result = base_result.mole();
        if (mol_start == mol_result && rad_start == rad_result &&
            (count_start == 0 || count_result == 0)) {
            val = val * start.multiplier() / result.multiplier();
            return val;
        }

        if (mol_start == mol_result &&
            ((rad_start == 0 &&
              (count_start == rad_result || count_start == 0)) ||
             (rad_result == 0 &&
              (count_result == rad_start || count_result == 0)))) {
            // define a conversion multiplier for radians<->count(rotations) of
            // various powers
            static constexpr std::array<double, 5> muxrad{
                {1.0 / (4.0 * constants::pi * constants::pi),
                 1.0 / (2.0 * constants::pi),
                 0.0,
                 2.0 * constants::pi,
                 4.0 * constants::pi * constants::pi}};
            int muxIndex =
                rad_result - rad_start + 2;  // +2 is to shift the index
            if (muxIndex < 0 || muxIndex > 4) {
                return constants::invalid_conversion;
            }
            val *= muxrad[muxIndex];
            // either 1 or the other is 0 in this equation other it would have
            // triggered before or not gotten here
            val = val * start.multiplier() / result.multiplier();
            return val;
        }
        if (rad_start == rad_result &&
            ((mol_start == 0 &&
              (count_start == mol_result || count_start == 0)) ||
             (mol_result == 0 &&
              (count_result == mol_start || count_result == 0)))) {
            // define multipliers for mol<->count conversions based on powers
            static constexpr std::array<double, 3> muxmol{
                {6.02214076e23, 0, 1.0 / 6.02214076e23}};

            const int muxIndex =
                mol_result - mol_start + 1;  // +1 is to shift the index
            if (muxIndex < 0 || muxIndex > 2) {
                return constants::invalid_conversion;
            }
            val *= muxmol[muxIndex];
            // either 1 or the other is 0 in this equation other it would have
            // triggered before or not gotten here
            val = val * start.multiplier() / result.multiplier();
            return val;
        }
        return constants::invalid_conversion;
    }